

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

bool __thiscall libDAI::TProb<double>::hasNegatives(TProb<double> *this)

{
  double *pdVar1;
  pointer pdVar2;
  bool bVar3;
  size_t i;
  ulong uVar4;
  
  pdVar2 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  bVar3 = false;
  while ((uVar4 < (ulong)((long)(this->_p).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) &&
         (!bVar3))) {
    pdVar1 = pdVar2 + uVar4;
    uVar4 = uVar4 + 1;
    bVar3 = *pdVar1 < 0.0;
  }
  return bVar3;
}

Assistant:

bool hasNegatives() const {
                bool Negatives = false;
                for( size_t i = 0; i < size() && !Negatives; i++ ) 
                    if( _p[i] < 0.0 )
                        Negatives = true;
                return Negatives;
            }